

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

int addSystemPropertiesTouMqttMessage
              (IOTHUB_MESSAGE_HANDLE iothub_message_handle,STRING_HANDLE topic_string,
              size_t *index_ptr,_Bool urlencode)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  LOGGER_LOG p_Var5;
  LOGGER_LOG l_2;
  char *component_name;
  LOGGER_LOG l_1;
  char *output_name;
  LOGGER_LOG l;
  char *message_creation_time_utc;
  char *content_encoding;
  char *content_type;
  char *msg_id;
  char *correlation_id;
  size_t sStack_30;
  _Bool is_security_msg;
  size_t index;
  int result;
  _Bool urlencode_local;
  size_t *index_ptr_local;
  STRING_HANDLE topic_string_local;
  IOTHUB_MESSAGE_HANDLE iothub_message_handle_local;
  
  index._0_4_ = 0;
  sStack_30 = *index_ptr;
  _Var2 = IoTHubMessage_IsSecurityMessage(iothub_message_handle);
  pcVar4 = IoTHubMessage_GetCorrelationId(iothub_message_handle);
  if (pcVar4 != (char *)0x0) {
    index._0_4_ = addSystemPropertyToTopicString(topic_string,sStack_30,"cid",pcVar4,urlencode);
    sStack_30 = sStack_30 + 1;
  }
  if (((int)index == 0) &&
     (pcVar4 = IoTHubMessage_GetMessageId(iothub_message_handle), pcVar4 != (char *)0x0)) {
    index._0_4_ = addSystemPropertyToTopicString(topic_string,sStack_30,"mid",pcVar4,urlencode);
    sStack_30 = sStack_30 + 1;
  }
  if (((int)index == 0) &&
     (pcVar4 = IoTHubMessage_GetContentTypeSystemProperty(iothub_message_handle),
     pcVar4 != (char *)0x0)) {
    index._0_4_ = addSystemPropertyToTopicString(topic_string,sStack_30,"ct",pcVar4,urlencode);
    sStack_30 = sStack_30 + 1;
  }
  if (((int)index == 0) &&
     (pcVar4 = IoTHubMessage_GetContentEncodingSystemProperty(iothub_message_handle),
     pcVar4 != (char *)0x0)) {
    cVar1 = urlencode;
    if (_Var2) {
      cVar1 = '\x01';
    }
    index._0_4_ = addSystemPropertyToTopicString(topic_string,sStack_30,"ce",pcVar4,cVar1 != '\0');
    sStack_30 = sStack_30 + 1;
  }
  if (((int)index == 0) &&
     (pcVar4 = IoTHubMessage_GetMessageCreationTimeUtcSystemProperty(iothub_message_handle),
     pcVar4 != (char *)0x0)) {
    index._0_4_ = addSystemPropertyToTopicString(topic_string,sStack_30,"ctime",pcVar4,urlencode);
    sStack_30 = sStack_30 + 1;
  }
  if (((int)index == 0) && (_Var2)) {
    iVar3 = addSystemPropertyToTopicString
                      (topic_string,sStack_30,"ifid","urn:azureiot:Security:SecurityAgent:1",true);
    if (iVar3 == 0) {
      index._0_4_ = 0;
      sStack_30 = sStack_30 + 1;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"addSystemPropertiesTouMqttMessage",0x36a,1,
                  "Failed setting Security interface id");
      }
      index._0_4_ = 0x36b;
      sStack_30 = sStack_30 + 1;
    }
  }
  if (((int)index == 0) &&
     (pcVar4 = IoTHubMessage_GetOutputName(iothub_message_handle), pcVar4 != (char *)0x0)) {
    iVar3 = addSystemPropertyToTopicString(topic_string,sStack_30,"on",pcVar4,urlencode);
    if (iVar3 == 0) {
      index._0_4_ = 0;
      sStack_30 = sStack_30 + 1;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"addSystemPropertiesTouMqttMessage",0x37c,1,"Failed setting output name");
      }
      index._0_4_ = 0x37d;
      sStack_30 = sStack_30 + 1;
    }
  }
  if (((int)index == 0) &&
     (pcVar4 = IoTHubMessage_GetComponentName(iothub_message_handle), pcVar4 != (char *)0x0)) {
    iVar3 = addSystemPropertyToTopicString(topic_string,sStack_30,"sub",pcVar4,urlencode);
    if (iVar3 == 0) {
      index._0_4_ = 0;
      sStack_30 = sStack_30 + 1;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"addSystemPropertiesTouMqttMessage",0x38e,1,"Failed setting component name");
      }
      index._0_4_ = 0x38f;
      sStack_30 = sStack_30 + 1;
    }
  }
  *index_ptr = sStack_30;
  return (int)index;
}

Assistant:

static int addSystemPropertiesTouMqttMessage(IOTHUB_MESSAGE_HANDLE iothub_message_handle, STRING_HANDLE topic_string, size_t* index_ptr, bool urlencode)
{
    int result = 0;
    size_t index = *index_ptr;

    bool is_security_msg = IoTHubMessage_IsSecurityMessage(iothub_message_handle);
    const char* correlation_id = IoTHubMessage_GetCorrelationId(iothub_message_handle);
    if (correlation_id != NULL)
    {
        result = addSystemPropertyToTopicString(topic_string, index, SYS_PROP_CORRELATION_ID, correlation_id, urlencode);
        index++;
    }
    if (result == 0)
    {
        const char* msg_id = IoTHubMessage_GetMessageId(iothub_message_handle);
        if (msg_id != NULL)
        {
            result = addSystemPropertyToTopicString(topic_string, index, SYS_PROP_MESSAGE_ID, msg_id, urlencode);
            index++;
        }
    }
    if (result == 0)
    {
        const char* content_type = IoTHubMessage_GetContentTypeSystemProperty(iothub_message_handle);
        if (content_type != NULL)
        {
            result = addSystemPropertyToTopicString(topic_string, index, SYS_PROP_CONTENT_TYPE, content_type, urlencode);
            index++;
        }
    }
    if (result == 0)
    {
        const char* content_encoding = IoTHubMessage_GetContentEncodingSystemProperty(iothub_message_handle);
        if (content_encoding != NULL)
        {
            // Security message require content encoding
            result = addSystemPropertyToTopicString(topic_string, index, SYS_PROP_CONTENT_ENCODING, content_encoding, is_security_msg ? true : urlencode);
            index++;
        }
    }

    if (result == 0)
    {
        const char* message_creation_time_utc = IoTHubMessage_GetMessageCreationTimeUtcSystemProperty(iothub_message_handle);
        if (message_creation_time_utc != NULL)
        {
            result = addSystemPropertyToTopicString(topic_string, index, SYS_PROP_MESSAGE_CREATION_TIME_UTC, message_creation_time_utc, urlencode);
            index++;
        }
    }

    if (result == 0)
    {
        if (is_security_msg)
        {
            // The Security interface Id value must be encoded
            if (addSystemPropertyToTopicString(topic_string, index++, SECURITY_INTERFACE_ID_MQTT, SECURITY_INTERFACE_ID_VALUE, true) != 0)
            {
                LogError("Failed setting Security interface id");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
    }

    if (result == 0)
    {
        const char* output_name = IoTHubMessage_GetOutputName(iothub_message_handle);
        if (output_name != NULL)
        {
            // Encode the output name if encoding is on
            if (addSystemPropertyToTopicString(topic_string, index++, SYS_PROP_ON, output_name, urlencode) != 0)
            {
                LogError("Failed setting output name");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
    }

    if (result == 0)
    {
        const char* component_name = IoTHubMessage_GetComponentName(iothub_message_handle);
        if (component_name != NULL)
        {
            // Encode the component name if encoding is on
            if (addSystemPropertyToTopicString(topic_string, index++, SYS_COMPONENT_NAME, component_name, urlencode) != 0)
            {
                LogError("Failed setting component name");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
    }

    *index_ptr = index;
    return result;
}